

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_inner.cpp
# Opt level: O1

idx_t duckdb::InitialNestedLoopJoin::Operation<duckdb::interval_t,duckdb::GreaterThan>
                (Vector *left,Vector *right,idx_t left_size,idx_t right_size,idx_t *lpos,idx_t *rpos
                ,SelectionVector *lvector,SelectionVector *rvector,idx_t current_match_count)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  interval_t *input;
  int *piVar11;
  ulong uVar12;
  idx_t iVar13;
  bool bVar14;
  bool bVar15;
  UnifiedVectorFormat right_data;
  UnifiedVectorFormat left_data;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(left,left_size,&local_78);
  Vector::ToUnifiedFormat(right,right_size,&local_c0);
  uVar12 = *rpos;
  if (uVar12 < right_size) {
    psVar1 = (local_c0.sel)->sel_vector;
    iVar13 = 0;
    do {
      if (psVar1 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar1[uVar12];
      }
      if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar14 = false;
      }
      else {
        bVar14 = (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0;
      }
      bVar15 = *lpos < left_size;
      if (bVar15) {
        if (iVar13 != 0x800) {
          piVar11 = (int *)(local_c0.data + uVar12 * 0x10);
          psVar2 = lvector->sel_vector;
          psVar3 = rvector->sel_vector;
          psVar4 = (local_78.sel)->sel_vector;
          uVar12 = *lpos;
          do {
            uVar7 = uVar12;
            if (psVar4 != (sel_t *)0x0) {
              uVar7 = (ulong)psVar4[uVar12];
            }
            if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar15 = false;
            }
            else {
              bVar15 = (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0;
            }
            if (!bVar15 && !bVar14) {
              lVar8 = uVar7 * 0x10;
              lVar5 = (long)*(int *)(local_78.data + lVar8 + 4) +
                      *(long *)(local_78.data + lVar8 + 8) / 86400000000;
              lVar10 = lVar5 % 0x1e;
              lVar9 = (long)*(int *)(local_78.data + lVar8) + lVar5 / 0x1e;
              lVar6 = (long)piVar11[1] + *(long *)(piVar11 + 2) / 86400000000;
              lVar5 = lVar6 % 0x1e;
              lVar6 = (long)*piVar11 + lVar6 / 0x1e;
              if ((lVar6 < lVar9) ||
                 ((lVar6 <= lVar9 &&
                  ((lVar5 < lVar10 ||
                   ((lVar5 <= lVar10 &&
                    (*(long *)(piVar11 + 2) % 86400000000 <
                     *(long *)(local_78.data + lVar8 + 8) % 86400000000)))))))) {
                psVar2[iVar13] = (sel_t)uVar12;
                psVar3[iVar13] = (sel_t)*rpos;
                iVar13 = iVar13 + 1;
              }
            }
            uVar7 = uVar12 + 1;
            *lpos = uVar7;
            if (left_size - 1 == uVar12) {
              bVar15 = false;
              goto LAB_00d07f09;
            }
            uVar12 = uVar7;
          } while (iVar13 != 0x800);
          bVar15 = uVar7 < left_size;
        }
      }
      else {
LAB_00d07f09:
        *lpos = 0;
      }
      if (bVar15) {
        iVar13 = 0x800;
        break;
      }
      uVar12 = *rpos + 1;
      *rpos = uVar12;
    } while (uVar12 < right_size);
  }
  else {
    iVar13 = 0;
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return iVar13;
}

Assistant:

static idx_t Operation(Vector &left, Vector &right, idx_t left_size, idx_t right_size, idx_t &lpos, idx_t &rpos,
	                       SelectionVector &lvector, SelectionVector &rvector, idx_t current_match_count) {
		using MATCH_OP = ComparisonOperationWrapper<OP>;

		// initialize phase of nested loop join
		// fill lvector and rvector with matches from the base vectors
		UnifiedVectorFormat left_data, right_data;
		left.ToUnifiedFormat(left_size, left_data);
		right.ToUnifiedFormat(right_size, right_data);

		auto ldata = UnifiedVectorFormat::GetData<T>(left_data);
		auto rdata = UnifiedVectorFormat::GetData<T>(right_data);
		idx_t result_count = 0;
		for (; rpos < right_size; rpos++) {
			idx_t right_position = right_data.sel->get_index(rpos);
			bool right_is_valid = right_data.validity.RowIsValid(right_position);
			for (; lpos < left_size; lpos++) {
				if (result_count == STANDARD_VECTOR_SIZE) {
					// out of space!
					return result_count;
				}
				idx_t left_position = left_data.sel->get_index(lpos);
				bool left_is_valid = left_data.validity.RowIsValid(left_position);
				if (MATCH_OP::Operation(ldata[left_position], rdata[right_position], !left_is_valid, !right_is_valid)) {
					// emit tuple
					lvector.set_index(result_count, lpos);
					rvector.set_index(result_count, rpos);
					result_count++;
				}
			}
			lpos = 0;
		}
		return result_count;
	}